

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * makeTempDir_abi_cxx11_(void)

{
  ostream *poVar1;
  int *piVar2;
  int iVar3;
  string *in_RDI;
  bool bVar4;
  Rand48 rand48;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  time((time_t *)0x0);
  while( true ) {
    std::__cxx11::string::assign((char *)in_RDI);
    iVar3 = 8;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      Imath_3_2::nrand48(rand48._state);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"tempDir = ");
    poVar1 = std::operator<<(poVar1,(string *)in_RDI);
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar3 = mkdir((in_RDI->_M_dataplus)._M_p,0x1ff);
    if (iVar3 == 0) break;
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR -- mkdir(");
      poVar1 = std::operator<<(poVar1,(string *)in_RDI);
      poVar1 = std::operator<<(poVar1,") failed: errno = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

string
makeTempDir ()
{
    string tempDir;

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
    while (true)
    {
#ifdef _WIN32
        char  tmpbuf[4096];
        DWORD len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";
#else
        tempDir = IMF_TMP_DIR "OpenEXRTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        std::cout << "tempDir = " << tempDir << std::endl;

        int status = mkdir (tempDir.c_str (), 0777);

        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            exit (1);
        }
    }

    return tempDir;
}